

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O3

Vec_Wec_t * Json_Read(char *pFileName,Abc_Nam_t **ppStrs)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *pIn;
  byte *__s;
  size_t sVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p;
  int *piVar8;
  Abc_Nam_t *p_00;
  ulong uVar9;
  byte *pbVar10;
  byte *pLim;
  byte *pbVar11;
  Vec_Int_t *p_01;
  uint Entry;
  uint uVar12;
  byte *pbVar13;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pVVar6 = (Vec_Wec_t *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    iVar3 = Extra_FileSize(pFileName);
    pIn = (char *)malloc((long)(iVar3 + 1));
    fread(pIn,(long)iVar3,1,__stream);
    pIn[iVar3] = '\0';
    fclose(__stream);
    __s = (byte *)Json_ReadPreprocess(pIn,iVar3);
    sVar5 = strlen((char *)__s);
    free(pIn);
    pVVar6 = (Vec_Wec_t *)malloc(0x10);
    pVVar6->nCap = 1000;
    pVVar6->nSize = 0;
    pVVar7 = (Vec_Int_t *)calloc(1000,0x10);
    pVVar6->pArray = pVVar7;
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    piVar8 = (int *)malloc(400);
    p->pArray = piVar8;
    p_00 = Abc_NamStart(1000,0x18);
    if (0 < (long)(int)sVar5) {
      Entry = 0;
      pbVar11 = __s;
LAB_0032d1b0:
      do {
        bVar1 = *pbVar11;
        uVar9 = (ulong)bVar1;
        pbVar13 = pbVar11;
        if (uVar9 < 0x3b) {
          if ((0x400000100002600U >> (uVar9 & 0x3f) & 1) != 0) {
            pbVar11 = pbVar11 + 1;
            goto LAB_0032d1b0;
          }
          if (uVar9 == 0) break;
        }
        while ((0x3a < (byte)uVar9 || ((0x400000100002600U >> (uVar9 & 0x3f) & 1) == 0))) {
          uVar9 = (ulong)pbVar13[1];
          pbVar13 = pbVar13 + 1;
        }
        if (bVar1 < 0x5d) {
          if ((bVar1 == 0x2c) || (bVar1 == 0x3a)) {
LAB_0032d310:
            pbVar11 = pbVar11 + 1;
          }
          else {
            if (bVar1 == 0x5b) goto LAB_0032d2bb;
LAB_0032d215:
            pbVar10 = pbVar13 + -1;
            if (pbVar13[-1] != 0x2c) {
              pbVar10 = pbVar13;
            }
            pLim = pbVar10 + -1;
            if (pbVar10[-1] != 0x22) {
              pLim = pbVar10;
            }
            iVar3 = Abc_NamStrFindOrAddLim
                              (p_00,(char *)(pbVar11 + (bVar1 == 0x22)),(char *)pLim,(int *)0x0);
            if ((long)p->nSize < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
            }
            iVar2 = p->pArray[(long)p->nSize + -1];
            if (((long)iVar2 < 0) || (Entry = pVVar6->nSize, (int)Entry <= iVar2))
            goto LAB_0032d4ad;
            if (iVar3 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            pVVar7 = pVVar6->pArray;
            Vec_IntPush(pVVar7 + iVar2,iVar3 * 2 + 1);
            pbVar11 = pbVar13;
          }
        }
        else {
          if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) {
            if (p->nSize < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
            }
            p->nSize = p->nSize + -1;
            goto LAB_0032d310;
          }
          if (bVar1 != 0x7b) goto LAB_0032d215;
LAB_0032d2bb:
          if (0 < (long)p->nSize) {
            iVar3 = p->pArray[(long)p->nSize + -1];
            if (((long)iVar3 < 0) || ((int)Entry <= iVar3)) {
LAB_0032d4ad:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            Vec_IntPush(pVVar7 + iVar3,Entry * 2);
            Entry = pVVar6->nSize;
          }
          Vec_IntPush(p,Entry);
          if (Entry == pVVar6->nCap) {
            if ((int)Entry < 0x10) {
              if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                pVVar7 = (Vec_Int_t *)malloc(0x100);
              }
              else {
                pVVar7 = (Vec_Int_t *)realloc(pVVar6->pArray,0x100);
              }
              pVVar6->pArray = pVVar7;
              pVVar7 = pVVar7 + (int)Entry;
              uVar12 = 0x10;
              uVar4 = 0x10 - Entry;
            }
            else {
              uVar12 = Entry * 2;
              if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                pVVar7 = (Vec_Int_t *)malloc((ulong)uVar12 << 4);
              }
              else {
                pVVar7 = (Vec_Int_t *)realloc(pVVar6->pArray,(ulong)uVar12 << 4);
              }
              pVVar6->pArray = pVVar7;
              pVVar7 = pVVar7 + Entry;
              uVar4 = Entry;
            }
            memset(pVVar7,0,(ulong)uVar4 << 4);
            pVVar6->nCap = uVar12;
          }
          uVar12 = Entry + 1;
          pVVar6->nSize = uVar12;
          if ((int)Entry < 0) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          pVVar7 = pVVar6->pArray;
          p_01 = pVVar7 + ((ulong)uVar12 - 1);
          if (p_01->nCap < 4) {
            if (pVVar7[(ulong)uVar12 - 1].pArray == (int *)0x0) {
              piVar8 = (int *)malloc(0x10);
            }
            else {
              piVar8 = (int *)realloc(pVVar7[(ulong)uVar12 - 1].pArray,0x10);
            }
            pVVar7[(ulong)uVar12 - 1].pArray = piVar8;
            if (piVar8 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            p_01->nCap = 4;
          }
          Vec_IntPush(p_01,(uint)(*pbVar11 == 0x5b));
          pbVar11 = pbVar11 + 1;
          Entry = uVar12;
        }
      } while (pbVar11 < __s + (int)sVar5);
    }
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
    }
    free(p);
    if (__s != (byte *)0x0) {
      free(__s);
    }
    *ppStrs = p_00;
  }
  return pVVar6;
}

Assistant:

Vec_Wec_t * Json_Read( char * pFileName, Abc_Nam_t ** ppStrs )
{
    Abc_Nam_t * pStrs; 
    Vec_Wec_t * vObjs; 
    Vec_Int_t * vStack, * vTemp;
    char * pContents, * pCur, * pNext, * pCur2, * pNext2;
    int nFileSize, RetValue, iToken;
    FILE * pFile;

    // read the file into the buffer
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    nFileSize = Extra_FileSize( pFileName );
    pContents = pCur = ABC_ALLOC( char, nFileSize+1 );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    pContents[nFileSize] = 0;
    fclose( pFile );

    pContents = Json_ReadPreprocess( pCur = pContents, nFileSize );
    nFileSize = strlen(pContents);
    ABC_FREE( pCur );
    pCur = pContents;

    // start data-structures
    vObjs  = Vec_WecAlloc( 1000 );
    vStack = Vec_IntAlloc( 100 );
    pStrs  = Abc_NamStart( 1000, 24 );
    //Json_AddTypes( pStrs );

    // read lines
    assert( Vec_WecSize(vObjs) == 0 );
    assert( Vec_IntSize(vStack) == 0 );
    while ( pCur < pContents + nFileSize )
    {
        pCur  = Json_SkipSpaces( pCur );
        if ( *pCur == '\0' )
            break;
        pNext = Json_SkipNonSpaces( pCur );
        if ( *pCur == '{' || *pCur == '[' )
        {
            // add fanin to node on the previous level
            if ( Vec_IntSize(vStack) > 0 )
                Vec_IntPush( Vec_WecEntry(vObjs, Vec_IntEntryLast(vStack)), Abc_Var2Lit(Vec_WecSize(vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( vStack, Vec_WecSize(vObjs) );
            vTemp = Vec_WecPushLevel( vObjs );
            Vec_IntGrow( vTemp, 4 );
            // remember it as an array
            Vec_IntPush( vTemp, (int)(*pCur == '[') );
            pCur++;
            continue;
        }
        if ( *pCur == '}' || *pCur == ']' )
        {
            Vec_IntPop( vStack );
            pCur++;
            continue;
        }
        if ( *pCur == ',' || *pCur == ':' )
        {
            pCur++;
            continue;
        }
        iToken = Json_TokenCompare( pCur, pNext, &pCur2, &pNext2 );
        if ( iToken == 0 )
            iToken = Abc_NamStrFindOrAddLim( pStrs, pCur2, pNext2, NULL );
        Vec_IntPush( Vec_WecEntry(vObjs, Vec_IntEntryLast(vStack)), Abc_Var2Lit(iToken, 1) );
        pCur = pNext;
    }
    Vec_IntFree( vStack );
    ABC_FREE( pContents );
    *ppStrs = pStrs;
    return vObjs;
}